

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockNodeTreeUpdateSplitter(ImGuiDockNode *node)

{
  undefined1 *puVar1;
  int *piVar2;
  float fVar3;
  ImVec2 IVar4;
  ImGuiAxis axis;
  ImGuiDockNode *node_00;
  ImGuiDockNode *node_01;
  ImDrawList *this;
  void *pvVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  uint uVar10;
  ImU32 col;
  ImGuiID IVar11;
  ulong uVar12;
  bool bVar13;
  long lVar14;
  ImVector<ImGuiDockNode_*> *pIVar15;
  ImGuiDockNode *pIVar16;
  ImGuiDockNode *pIVar17;
  int iVar18;
  ImGuiDockNode **ppIVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  float cur_size_1;
  ImVector<ImGuiDockNode_*> touching_nodes [2];
  float cur_size_0;
  float local_98;
  float local_94;
  ImRect local_90;
  float local_80;
  float local_7c;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  ImVector<ImGuiDockNode_*> local_68;
  ImVec2 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  pIVar8 = GImGui;
  node_00 = node->ChildNodes[0];
  if (node_00 == (ImGuiDockNode *)0x0) {
    return;
  }
  node_01 = node->ChildNodes[1];
  if ((node_00->field_0xbd & 2) != 0) {
    if ((node_01->field_0xbd & 2) != 0) {
      axis = node->SplitAxis;
      lVar20 = (long)axis;
      if (lVar20 == -1) {
        __assert_fail("axis != ImGuiAxis_None",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x3b29,"void ImGui::DockNodeTreeUpdateSplitter(ImGuiDockNode *)");
      }
      local_90.Min = node_00->Pos;
      local_90.Max = node_01->Pos;
      if (1 < (uint)axis) {
        __assert_fail("idx <= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                      ,0x110,"float &ImVec2::operator[](size_t)");
      }
      (&local_90.Min.x)[lVar20] =
           *(float *)((long)node_00->ChildNodes + lVar20 * 4 + 0x30) + (&local_90.Min.x)[lVar20];
      uVar12 = (ulong)(uint)axis ^ 1;
      (&local_90.Max.x)[uVar12] =
           *(float *)((long)node_01->ChildNodes + uVar12 * 4 + 0x30) + (&local_90.Max.x)[uVar12];
      uVar10 = node_01->MergedFlags | node_00->MergedFlags;
      if (((uVar10 & 0x20) == 0) &&
         ((uVar10 & (uint)((ulong)(uint)axis != 0) * 0x400000 + 0x400000) == 0)) {
        PushID(node->ID);
        local_68.Size = 0;
        local_68.Capacity = 0;
        local_68.Data = (ImGuiDockNode **)0x0;
        local_78._0_4_ = 0.0;
        local_78._4_4_ = 0.0;
        uStack_70 = (ImGuiDockNode **)0x0;
        fVar3 = (&(pIVar8->Style).WindowMinSize.x)[lVar20];
        local_48 = ZEXT416((uint)(*(float *)((long)node->ChildNodes[0]->ChildNodes +
                                            lVar20 * 4 + 0x28) + fVar3));
        fVar22 = *(float *)((long)node->ChildNodes[1]->ChildNodes + lVar20 * 4 + 0x28);
        fVar21 = *(float *)((long)node->ChildNodes[1]->ChildNodes + lVar20 * 4 + 0x30);
        IVar11 = ImGuiWindow::GetID(GImGui->CurrentWindow,"##Splitter",(char *)0x0);
        local_98 = (fVar22 + fVar21) - fVar3;
        if (pIVar8->ActiveId == IVar11) {
          DockNodeTreeUpdateSplitterFindTouchingNode
                    (node_00,axis,1,(ImVector<ImGuiDockNode_*> *)local_78);
          DockNodeTreeUpdateSplitterFindTouchingNode(node_01,axis,0,&local_68);
          if (0 < (long)(int)local_78._0_4_) {
            lVar14 = 0;
            fVar22 = (float)local_48._0_4_;
            do {
              local_58 = uStack_70[lVar14]->Pos;
              IVar4 = uStack_70[lVar14]->Size;
              uStack_50 = CONCAT44(IVar4.y + local_58.y,IVar4.x + local_58.x);
              fVar21 = (&local_58.x)[lVar20] + fVar3;
              uVar10 = -(uint)(fVar21 <= fVar22);
              fVar22 = (float)(uVar10 & (uint)fVar22 | ~uVar10 & (uint)fVar21);
              local_48 = ZEXT416((uint)fVar22);
              lVar14 = lVar14 + 1;
            } while ((int)local_78._0_4_ != lVar14);
          }
          if (0 < (long)local_68.Size) {
            lVar14 = 0;
            do {
              pIVar17 = local_68.Data[lVar14];
              local_58 = pIVar17->Pos;
              uStack_50 = CONCAT44((pIVar17->Size).y + (pIVar17->Pos).y,
                                   (pIVar17->Size).x + (pIVar17->Pos).x);
              if (*(float *)(local_48 + lVar20 * 4 + -8) - fVar3 <= local_98) {
                local_98 = *(float *)(local_48 + lVar20 * 4 + -8) - fVar3;
              }
              lVar14 = lVar14 + 1;
            } while (local_68.Size != lVar14);
          }
        }
        local_58.x = *(float *)((long)node_00->ChildNodes + lVar20 * 4 + 0x30);
        local_94 = *(float *)((long)node_01->ChildNodes + lVar20 * 4 + 0x30);
        local_7c = *(float *)((long)node_00->ChildNodes + lVar20 * 4 + 0x28);
        fVar3 = *(float *)((long)node_01->ChildNodes + lVar20 * 4 + 0x28);
        local_80 = local_94;
        IVar11 = ImGuiWindow::GetID(GImGui->CurrentWindow,"##Splitter",(char *)0x0);
        bVar9 = SplitterBehavior(&local_90,IVar11,axis,&local_58.x,&local_94,
                                 (float)local_48._0_4_ - local_7c,(fVar3 + local_80) - local_98,4.0,
                                 0.04);
        if (((bVar9) && (0 < (int)local_78._0_4_)) && (0 < local_68.Size)) {
          *(float *)((long)node_00->ChildNodes + lVar20 * 4 + 0x38) = local_58.x;
          *(float *)((long)node_00->ChildNodes + lVar20 * 4 + 0x30) = local_58.x;
          *(float *)((long)node_01->ChildNodes + lVar20 * 4 + 0x28) =
               *(float *)((long)node_01->ChildNodes + lVar20 * 4 + 0x28) -
               (local_94 - *(float *)((long)node_01->ChildNodes + lVar20 * 4 + 0x30));
          *(float *)((long)node_01->ChildNodes + lVar20 * 4 + 0x38) = local_94;
          *(float *)((long)node_01->ChildNodes + lVar20 * 4 + 0x30) = local_94;
          lVar20 = 0;
          pIVar15 = (ImVector<ImGuiDockNode_*> *)local_78;
          bVar9 = true;
          do {
            bVar13 = bVar9;
            iVar18 = pIVar15->Size;
            if (0 < iVar18) {
              lVar14 = 0;
              do {
                pIVar17 = pIVar15->Data[lVar14];
                pIVar16 = pIVar17->ParentNode;
                if (pIVar16 != node) {
                  do {
                    ppIVar19 = &pIVar17->ParentNode;
                    pIVar17 = pIVar16;
                    if (pIVar16->SplitAxis == axis) {
                      puVar1 = &pIVar16->ChildNodes[lVar20]->field_0xbc;
                      *(ushort *)puVar1 = *(ushort *)puVar1 | 0x8000;
                      pIVar17 = *ppIVar19;
                    }
                    pIVar16 = pIVar17->ParentNode;
                  } while (pIVar16 != node);
                  iVar18 = pIVar15->Size;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 < iVar18);
            }
            lVar20 = 1;
            pIVar15 = &local_68;
            bVar9 = false;
          } while (bVar13);
          DockNodeTreeUpdatePosSize(node_00,node_00->Pos,node_00->Size,false);
          DockNodeTreeUpdatePosSize(node_01,node_01->Pos,node_01->Size,false);
          if (GImGui->SettingsDirtyTimer <= 0.0) {
            GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
          }
        }
        PopID();
        lVar20 = 0x20;
        do {
          pvVar5 = *(void **)((long)&local_80 + lVar20);
          if (pvVar5 != (void *)0x0) {
            if (GImGui != (ImGuiContext *)0x0) {
              piVar2 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar2 = *piVar2 + -1;
            }
            (*GImAllocatorFreeFunc)(pvVar5,GImAllocatorUserData);
          }
          lVar20 = lVar20 + -0x10;
        } while (lVar20 != 0);
      }
      else {
        this = GImGui->CurrentWindow->DrawList;
        local_78._0_4_ = (GImGui->Style).Colors[0x1b].x;
        local_78._4_4_ = (GImGui->Style).Colors[0x1b].y;
        uVar6 = (GImGui->Style).Colors[0x1b].z;
        uVar7 = (GImGui->Style).Colors[0x1b].w;
        uStack_70 = (ImGuiDockNode **)CONCAT44((GImGui->Style).Alpha * (float)uVar7,uVar6);
        col = ColorConvertFloat4ToU32((ImVec4 *)local_78);
        ImDrawList::AddRectFilled
                  (this,&local_90.Min,&local_90.Max,col,(pIVar8->Style).FrameRounding,0);
      }
      if ((node_00->field_0xbd & 2) == 0) goto LAB_0014b6e1;
    }
    DockNodeTreeUpdateSplitter(node_00);
  }
LAB_0014b6e1:
  if ((node_01->field_0xbd & 2) != 0) {
    DockNodeTreeUpdateSplitter(node_01);
  }
  return;
}

Assistant:

const ImWchar* ImStrbolW(const ImWchar* buf_mid_line, const ImWchar* buf_begin) // find beginning-of-line
{
    while (buf_mid_line > buf_begin && buf_mid_line[-1] != '\n')
        buf_mid_line--;
    return buf_mid_line;
}